

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

bool __thiscall
asl::Array<asl::WebSocket_*>::removeOne(Array<asl::WebSocket_*> *this,WebSocket **x,int i0)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = *(int *)(this->_a + -2);
  uVar2 = 0xffffffff;
  if (i0 < iVar1) {
    lVar3 = 0;
    do {
      if (this->_a[i0 + lVar3] == *x) {
        uVar2 = i0 + (int)lVar3;
        break;
      }
      lVar3 = lVar3 + 1;
    } while ((long)iVar1 - (long)i0 != lVar3);
  }
  if (uVar2 != 0xffffffff) {
    remove(this,(char *)(ulong)uVar2);
  }
  return uVar2 != 0xffffffff;
}

Assistant:

Data&       d() { return *((Data*)_a - 1); }